

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var __thiscall
Js::TypedArrayBase::FindMinOrMax<unsigned_short,false>
          (TypedArrayBase *this,ScriptContext *scriptContext,bool findMax)

{
  ushort uVar1;
  unsigned_short *puVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint uVar7;
  ArrayBufferBase *pAVar8;
  undefined4 *puVar9;
  Var pvVar10;
  uint local_34;
  unsigned_short compare;
  uint i;
  unsigned_short currentRes;
  uint len;
  unsigned_short *typedBuffer;
  bool findMax_local;
  ScriptContext *scriptContext_local;
  TypedArrayBase *this_local;
  
  puVar2 = (unsigned_short *)this->buffer;
  uVar5 = ArrayObject::GetLength((ArrayObject *)this);
  uVar6 = GetByteOffset(this);
  pAVar8 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
  uVar7 = (*(pAVar8->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar7 < (ulong)uVar6 + 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9e8,
                                "(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())",
                                "sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  compare = *puVar2;
  local_34 = 0;
  do {
    if (uVar5 <= local_34) {
      pvVar10 = JavascriptNumber::ToVarNoCheck((double)compare,scriptContext);
      return pvVar10;
    }
    uVar6 = GetByteOffset(this);
    pAVar8 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
    uVar7 = (*(pAVar8->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar7 < (ulong)(local_34 + 1) * 2 + (ulong)uVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                  ,0x9ec,
                                  "((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    uVar1 = puVar2[local_34];
    if (findMax) {
      if (compare < uVar1) {
LAB_013a4726:
        compare = uVar1;
      }
    }
    else if (uVar1 < compare) goto LAB_013a4726;
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        T* typedBuffer = (T*)this->buffer;
        uint len = this->GetLength();

        Assert(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
        T currentRes = typedBuffer[0];
        for (uint i = 0; i < len; i++)
        {
            Assert((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            T compare = typedBuffer[i];
            if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
            if (findMax ? currentRes < compare : currentRes > compare ||
                (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
            {
                currentRes = compare;
            }
        }
        return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
    }